

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unixDelete(unqlite_vfs *NotUsed,char *zPath,int dirSync)

{
  int iVar1;
  int *piVar2;
  int local_2c;
  int local_28;
  int fd;
  int rc;
  int dirSync_local;
  char *zPath_local;
  unqlite_vfs *NotUsed_local;
  
  local_28 = 0;
  zPath_local = (char *)0x0;
  fd = dirSync;
  _rc = zPath;
  iVar1 = unlink(zPath);
  if ((iVar1 == -1) && (piVar2 = __errno_location(), *piVar2 != 2)) {
    NotUsed_local._4_4_ = -2;
  }
  else {
    if ((fd != 0) && (local_28 = openDirectory(_rc,&local_2c), local_28 == 0)) {
      iVar1 = fsync(local_2c);
      if (iVar1 != 0) {
        local_28 = -2;
      }
      iVar1 = close(local_2c);
      if ((iVar1 != 0) && (local_28 == 0)) {
        local_28 = -2;
      }
    }
    NotUsed_local._4_4_ = local_28;
  }
  return NotUsed_local._4_4_;
}

Assistant:

static int unixDelete(
  unqlite_vfs *NotUsed,     /* VFS containing this as the xDelete method */
  const char *zPath,        /* Name of file to be deleted */
  int dirSync               /* If true, fsync() directory after deleting file */
){
  int rc = UNQLITE_OK;
  SXUNUSED(NotUsed);
  
  if( unlink(zPath)==(-1) && errno!=ENOENT ){
	  return UNQLITE_IOERR;
  }
#ifndef UNQLITE_DISABLE_DIRSYNC
  if( dirSync ){
    int fd;
    rc = openDirectory(zPath, &fd);
    if( rc==UNQLITE_OK ){
      if( fsync(fd) )
      {
        rc = UNQLITE_IOERR;
      }
      if( close(fd) && !rc ){
        rc = UNQLITE_IOERR;
      }
    }
  }
#endif
  return rc;
}